

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

SUNErrCode SUNLinSolSpace_SPGMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  sunindextype lrw1;
  sunindextype liw1;
  int maxl;
  SUNContext_conflict sunctx_local_scope_;
  long local_38;
  long local_30;
  int local_24;
  long local_20;
  long *local_18;
  long *local_10;
  
  local_20 = in_RDI[2];
  local_24 = *(int *)*in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(*(long *)(*(long *)(*in_RDI + 0x88) + 8) + 0x20) == 0) {
    local_30 = 0;
    local_38 = 0;
  }
  else {
    N_VSpace(*(undefined8 *)(*in_RDI + 0x88),&local_38,&local_30);
  }
  *local_10 = local_38 * (local_24 + 5) + (long)(local_24 * (local_24 + 5)) + 2;
  *local_18 = local_30 * (local_24 + 5);
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSpace_SPGMR(SUNLinearSolver S, long int* lenrwLS,
                                long int* leniwLS)
{
  SUNFunctionBegin(S->sunctx);
  int maxl;
  sunindextype liw1, lrw1;
  maxl = SPGMR_CONTENT(S)->maxl;
  if (SPGMR_CONTENT(S)->vtemp->ops->nvspace)
  {
    N_VSpace(SPGMR_CONTENT(S)->vtemp, &lrw1, &liw1);
    SUNCheckLastErr();
  }
  else { lrw1 = liw1 = 0; }
  *lenrwLS = lrw1 * (maxl + 5) + maxl * (maxl + 5) + 2;
  *leniwLS = liw1 * (maxl + 5);
  return SUN_SUCCESS;
}